

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O0

void __thiscall Assimp::DefaultLogger::OnDebug(DefaultLogger *this,char *message)

{
  uint uVar1;
  char local_428 [8];
  char msg [1040];
  char *message_local;
  DefaultLogger *this_local;
  
  if ((this->super_Logger).m_Severity != NORMAL) {
    msg._1032_8_ = message;
    uVar1 = GetThreadID(this);
    snprintf(local_428,0x410,"Debug, T%u: %s",(ulong)uVar1,msg._1032_8_);
    WriteToStreams(this,local_428,Debugging);
  }
  return;
}

Assistant:

void DefaultLogger::OnDebug( const char* message ) {
    if ( m_Severity == Logger::NORMAL ) {
        return;
    }

	static const size_t Size = MAX_LOG_MESSAGE_LENGTH + 16;
	char msg[Size];
	ai_snprintf(msg, Size, "Debug, T%u: %s", GetThreadID(), message);

    WriteToStreams( msg, Logger::Debugging );
}